

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

string * duckdb::CastExceptionText<int,_unsigned_short>(int input)

{
  bool bVar1;
  string *in_RDI;
  int32_t in_stack_fffffffffffffdfc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  string asStack_1e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  string asStack_1c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1a0;
  string asStack_180 [32];
  string asStack_160 [32];
  string asStack_140 [32];
  string asStack_120 [15];
  PhysicalType in_stack_fffffffffffffeef;
  string asStack_100 [32];
  string asStack_e0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b0;
  string asStack_90 [32];
  string asStack_70 [32];
  string asStack_50 [32];
  string asStack_30 [48];
  
  bVar1 = TypeIsNumber<int>();
  if ((bVar1) && (bVar1 = TypeIsNumber<unsigned_short>(), bVar1)) {
    GetTypeId<int>();
    pbVar2 = &bStack_b0;
    TypeIdToString(in_stack_fffffffffffffeef);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              ((char *)pbVar2,in_stack_fffffffffffffe00);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (pbVar2,(char *)in_stack_fffffffffffffe00);
    ConvertToString::Operation<int>(in_stack_fffffffffffffdfc);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (pbVar2,(char *)in_stack_fffffffffffffe00);
    GetTypeId<unsigned_short>();
    TypeIdToString(in_stack_fffffffffffffeef);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    ::std::__cxx11::string::~string(asStack_100);
    ::std::__cxx11::string::~string(asStack_30);
    ::std::__cxx11::string::~string(asStack_50);
    ::std::__cxx11::string::~string(asStack_e0);
    ::std::__cxx11::string::~string(asStack_70);
    ::std::__cxx11::string::~string(asStack_90);
    ::std::__cxx11::string::~string((string *)&bStack_b0);
  }
  else {
    GetTypeId<int>();
    pbVar2 = &bStack_1a0;
    TypeIdToString(in_stack_fffffffffffffeef);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              ((char *)in_stack_fffffffffffffe08,pbVar2);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffffe08,(char *)pbVar2);
    ConvertToString::Operation<int>(in_stack_fffffffffffffdfc);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffffe08,(char *)pbVar2);
    GetTypeId<unsigned_short>();
    TypeIdToString(in_stack_fffffffffffffeef);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    ::std::__cxx11::string::~string(asStack_1e0);
    ::std::__cxx11::string::~string(asStack_120);
    ::std::__cxx11::string::~string(asStack_140);
    ::std::__cxx11::string::~string(asStack_1c0);
    ::std::__cxx11::string::~string(asStack_160);
    ::std::__cxx11::string::~string(asStack_180);
    ::std::__cxx11::string::~string((string *)&bStack_1a0);
  }
  return in_RDI;
}

Assistant:

static string CastExceptionText(SRC input) {
	if (std::is_same<SRC, string_t>()) {
		return "Could not convert string '" + ConvertToString::Operation<SRC>(input) + "' to " +
		       TypeIdToString(GetTypeId<DST>());
	}
	if (TypeIsNumber<SRC>() && TypeIsNumber<DST>()) {
		return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
		       " can't be cast because the value is out of range for the destination type " +
		       TypeIdToString(GetTypeId<DST>());
	}
	return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
	       " can't be cast to the destination type " + TypeIdToString(GetTypeId<DST>());
}